

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_io.c
# Opt level: O0

light_pcapng light_read_from_path(char *file_name)

{
  __fd_t fd_00;
  void *buf;
  __fd_t fd_01;
  __fd_t fd;
  size_t size;
  uint32_t *memory;
  light_pcapng head;
  size_t in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffe0;
  light_pcapng local_8;
  
  fd_00 = light_open(in_stack_ffffffffffffffe0,LIGHT_OREAD);
  if (fd_00 == (__fd_t)0x0) {
    fprintf(_stderr,"ERROR at %s::%s::%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_io.c",
            "light_read_from_path",0x26,"could not open file");
    local_8 = (light_pcapng)0x0;
  }
  else {
    buf = (void *)light_size(fd_00);
    fd_01 = (__fd_t)calloc((size_t)buf,1);
    if (fd_01 == (__fd_t)0x0) {
      fprintf(_stderr,"Unable to alloc %zu bytes\n",buf);
      light_close((__fd_t)0x103cc0);
      local_8 = (light_pcapng)0x0;
    }
    else {
      light_read(fd_01,buf,(size_t)fd_00);
      local_8 = light_read_from_memory((uint32_t *)fd_00,in_stack_ffffffffffffffc8);
      light_close((__fd_t)0x103cfd);
      free(fd_01);
    }
  }
  return local_8;
}

Assistant:

light_pcapng light_read_from_path(const char *file_name)
{
	light_pcapng head;
	uint32_t *memory;
	size_t size = 0;
	__fd_t fd = light_open(file_name, LIGHT_OREAD);
	DCHECK_ASSERT_EXP(fd != NULL, "could not open file", return NULL);

	size = light_size(fd);
	// DCHECK_INT(size, 0, light_stop);

	memory = calloc(size, 1);
	if (memory == NULL) {
		fprintf(stderr, "Unable to alloc %zu bytes\n", size);
		light_close(fd);
		return NULL;
	}

	// DCHECK_INT(light_read(fd, memory, size), size - 1, light_stop);
	light_read(fd, memory, size);

	head = light_read_from_memory(memory, size);

	light_close(fd);
	free(memory);

	return head;
}